

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_accessor_2.cpp
# Opt level: O1

void __thiscall UDPSocket::~UDPSocket(UDPSocket *this)

{
  this->_vptr_UDPSocket = (_func_int **)&PTR__UDPSocket_00119e48;
  close((this->super_Socket).sockfd);
  return;
}

Assistant:

UDPSocket::~UDPSocket() {
#ifdef _WIN32
  closesocket(sockfd);
  WSACleanup();
#else
  close(sockfd);
#endif
}